

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpivotL.c
# Opt level: O3

int cpivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 uVar1;
  int_t iVar2;
  void *pvVar3;
  int_t *piVar4;
  flops_t *pfVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  singlecomplex *z;
  ulong uVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  singlecomplex temp;
  singlecomplex one;
  singlecomplex local_88 [2];
  void *local_78;
  void *local_70;
  double local_68;
  flops_t *local_60;
  ulong local_58;
  long local_50;
  int *local_48;
  ulong local_40;
  singlecomplex local_38;
  
  local_58 = (ulong)(uint)jcol;
  local_38.r = 1.0;
  local_38.i = 0.0;
  local_60 = stat->ops;
  pvVar3 = Glu->lusup;
  local_50 = (long)Glu->xsup[Glu->supno[jcol]];
  iVar7 = Glu->xlsub[local_50];
  iVar11 = Glu->xlsub[local_50 + 1] - iVar7;
  iVar6 = Glu->xlusup[local_50];
  lVar9 = (long)Glu->xlusup[jcol];
  piVar4 = Glu->lsub;
  iVar10 = jcol - Glu->xsup[Glu->supno[jcol]];
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  local_40 = (ulong)(uint)(iVar11 - iVar10);
  if (iVar11 - iVar10 == 0 || iVar11 < iVar10) {
LAB_0010a0dc:
    *usepr = 0;
    return jcol + 1;
  }
  local_70 = (void *)((long)pvVar3 + (long)iVar6 * 8);
  local_78 = (void *)((long)pvVar3 + lVar9 * 8);
  iVar6 = iperm_c[jcol];
  uVar12 = (ulong)iVar10;
  z = (singlecomplex *)(uVar12 * 8 + lVar9 * 8 + (long)pvVar3);
  fVar16 = 0.0;
  uVar13 = 0xffffffff;
  iVar14 = iVar10;
  iVar8 = iVar10;
  local_68 = u;
  local_48 = perm_r;
  do {
    dVar17 = c_abs1(z);
    pfVar5 = local_60;
    pvVar3 = local_78;
    fVar15 = (float)dVar17;
    if (fVar16 < fVar15) {
      iVar14 = (int)uVar12;
    }
    if ((*usepr != 0) && (piVar4[(long)iVar7 + uVar12] == *pivrow)) {
      iVar8 = (int)uVar12;
    }
    if (fVar15 <= fVar16) {
      fVar15 = fVar16;
    }
    fVar16 = fVar15;
    if (piVar4[(long)iVar7 + uVar12] == iVar6) {
      uVar13 = uVar12 & 0xffffffff;
    }
    uVar12 = uVar12 + 1;
    z = z + 1;
  } while ((long)uVar12 < (long)iVar11);
  jcol = (int)local_58;
  if ((fVar16 == 0.0) && (!NAN(fVar16))) goto LAB_0010a0dc;
  dVar17 = (double)fVar16 * local_68;
  if (*usepr != 0) {
    dVar18 = c_abs1((singlecomplex *)((long)iVar8 * 8 + (long)local_78));
    fVar16 = (float)dVar18;
    if (((fVar16 == 0.0) && (!NAN(fVar16))) || (fVar16 < (float)dVar17)) {
      *usepr = 0;
    }
    else {
      iVar14 = iVar8;
      if (*usepr != 0) {
        iVar6 = *pivrow;
        goto LAB_0010a1d6;
      }
    }
  }
  iVar8 = iVar14;
  if (-1 < (int)uVar13) {
    dVar18 = c_abs1((singlecomplex *)(uVar13 * 8 + (long)pvVar3));
    fVar16 = (float)dVar18;
    iVar6 = (int)uVar13;
    if (fVar16 < (float)dVar17) {
      iVar6 = iVar14;
    }
    if (fVar16 != 0.0) {
      iVar14 = iVar6;
    }
    iVar8 = iVar14;
    if (NAN(fVar16)) {
      iVar8 = iVar6;
    }
  }
  iVar6 = piVar4[(long)iVar7 + (long)iVar8];
  *pivrow = iVar6;
LAB_0010a1d6:
  local_48[iVar6] = jcol;
  if (iVar8 != iVar10) {
    iVar2 = piVar4[(long)iVar7 + (long)iVar8];
    piVar4[(long)iVar7 + (long)iVar8] = piVar4[(long)iVar7 + (long)iVar10];
    piVar4[(long)iVar7 + (long)iVar10] = iVar2;
    if (-1 < iVar10) {
      uVar12 = (ulong)((jcol - (int)local_50) + 1);
      iVar7 = iVar10;
      do {
        local_88[0] = *(singlecomplex *)((long)local_70 + (long)iVar8 * 8);
        *(undefined8 *)((long)local_70 + (long)iVar8 * 8) =
             *(undefined8 *)((long)local_70 + (long)iVar7 * 8);
        *(singlecomplex *)((long)local_70 + (long)iVar7 * 8) = local_88[0];
        iVar7 = iVar7 + iVar11;
        iVar8 = iVar8 + iVar11;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
  }
  pfVar5[7] = (float)((int)local_40 * 10) + pfVar5[7];
  c_div(local_88,&local_38,(singlecomplex *)((long)iVar10 * 8 + (long)pvVar3));
  if (iVar11 <= iVar10 + 1) {
    return 0;
  }
  lVar9 = (long)(iVar10 + 1);
  do {
    uVar1 = *(undefined8 *)((long)pvVar3 + lVar9 * 8);
    fVar16 = (float)uVar1;
    fVar15 = (float)((ulong)uVar1 >> 0x20);
    *(ulong *)((long)pvVar3 + lVar9 * 8) =
         CONCAT44(fVar15 * local_88[0].r + fVar16 * local_88[0].i,
                  fVar16 * local_88[0].r + -fVar15 * local_88[0].i);
    lVar9 = lVar9 + 1;
  } while (lVar9 < iVar11);
  return 0;
}

Assistant:

int
cpivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    singlecomplex one = {1.0, 0.0};
    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    float       pivmax, rtemp, thresh;
    singlecomplex       temp;
    singlecomplex       *lu_sup_ptr; 
    singlecomplex       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    singlecomplex       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (singlecomplex *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
        rtemp = c_abs1 (&lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = c_abs1 (&lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
            rtemp = c_abs1 (&lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += 10 * (nsupr - nsupc);

    c_div(&temp, &one, &lu_col_ptr[nsupc]);
    for (k = nsupc+1; k < nsupr; k++) 
	cc_mult(&lu_col_ptr[k], &lu_col_ptr[k], &temp);

    return 0;
}